

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cs_impl::
cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::path_cs_ext::path_info_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::path_cs_ext::path_info_&)>
::_call<0>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::path_cs_ext::path_info_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::path_cs_ext::path_info_&)>
           *this,vector *args,sequence<0> *param_2)

{
  path_info *ppVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ppVar1 = try_convert_and_check<const_cs_impl::path_cs_ext::path_info_&,_const_cs_impl::path_cs_ext::path_info_&,_cs_impl::path_cs_ext::path_info,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  if ((this->mFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->mFunc)._M_invoker)(&local_38,(_Any_data *)this,ppVar1);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_38.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_38.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = local_38._M_string_length;
    return __return_storage_ptr__;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}